

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::format_error_code
          (internal *this,buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 in_register_00000014;
  uint value;
  long lVar9;
  buffer<char> *c;
  writer w;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> local_38;
  
  pcVar7 = message.data_;
  value = (uint)out;
  lVar9 = 0;
  *(undefined8 *)(this + 0x10) = 0;
  uVar3 = -value;
  if (0 < (int)value) {
    uVar3 = value;
  }
  uVar6 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  local_38.locale_.locale_ = (void *)0x0;
  pcVar8 = (char *)(0x1ec - ((((ulong)out & 0xffffffff) >> 0x1f) +
                            (ulong)((uVar6 - (uVar3 < *(uint *)(basic_data<void>::
                                                                zero_or_powers_of_10_32 +
                                                               (ulong)uVar6 * 4))) + 1)));
  local_38.out_.container = (buffer<char> *)this;
  if (pcVar8 < pcVar7) goto LAB_0118d8a3;
  pcVar4 = *(char **)(this + 0x18);
  if (pcVar4 < pcVar7) {
    (*(code *)**(undefined8 **)this)(this,pcVar7,error_code,pcVar8,message.size_);
    *(char **)(this + 0x10) = pcVar7;
LAB_0118d85e:
    lVar9 = *(long *)(this + 8);
    pcVar8 = (char *)0x0;
    do {
      pcVar8[lVar9] = pcVar8[CONCAT44(in_register_00000014,error_code)];
      pcVar8 = pcVar8 + 1;
    } while (pcVar7 != pcVar8);
    lVar9 = *(long *)(this + 0x10);
    pcVar4 = *(char **)(this + 0x18);
  }
  else {
    *(char **)(this + 0x10) = pcVar7;
    if (pcVar7 != (char *)0x0) goto LAB_0118d85e;
    lVar9 = 0;
  }
  pcVar7 = (char *)(lVar9 + 2);
  if (pcVar4 < pcVar7) {
    (*(code *)**(undefined8 **)this)(this,pcVar7);
  }
  *(char **)(this + 0x10) = pcVar7;
  *(undefined2 *)(*(long *)(this + 8) + lVar9) = 0x203a;
  lVar9 = *(long *)(this + 0x10);
LAB_0118d8a3:
  uVar1 = lVar9 + 6;
  if (*(ulong *)(this + 0x18) < uVar1) {
    (*(code *)**(undefined8 **)this)(this,uVar1);
  }
  *(ulong *)(this + 0x10) = uVar1;
  lVar2 = *(long *)(this + 8);
  lVar5 = 0;
  do {
    *(char *)(lVar9 + lVar2 + lVar5) = "error "[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  basic_writer<duckdb_fmt::v6::buffer_range<char>_>::write_decimal<int>(&local_38,value);
  return;
}

Assistant:

FMT_FUNC void format_error_code(internal::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  internal::writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}